

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pooling.cpp
# Opt level: O3

void CoreMLConverter::convertCaffePooling(ConvertLayerParameters layerParameters)

{
  RepeatedField<unsigned_long> *pRVar1;
  Rep *pRVar2;
  string *layerName;
  int iVar3;
  uint uVar4;
  Type *pTVar5;
  Type *this;
  LayerUnion this_00;
  WeightParams *pWVar6;
  BoxCoordinatesMode *pBVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint32 uVar12;
  void **ppvVar13;
  uint32 uVar14;
  PoolingParameter *pPVar15;
  long in_stack_00000008;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  int *in_stack_00000048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  RepeatedPtrFieldBase *local_78;
  string local_70;
  string local_50;
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (in_stack_00000018,(Type *)0x0);
  if (((pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     (iVar3 = 1, (pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_e0,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    iVar3 = (pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_78 = in_stack_00000018;
  local_c0 = in_stack_00000028;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar5->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar13 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar13 = (void **)0x0;
  }
  if (iVar3 != 0) {
    lVar10 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_98,*(value_type **)((long)ppvVar13 + lVar10));
      lVar10 = lVar10 + 8;
    } while ((long)iVar3 * 8 != lVar10);
  }
  pRVar2 = (pTVar5->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar13 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar13 = (void **)0x0;
  }
  lVar10 = (long)(pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar10 != 0) {
    lVar11 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_b8,*(value_type **)((long)ppvVar13 + lVar11));
      lVar11 = lVar11 + 8;
    } while (lVar10 * 8 != lVar11);
  }
  convertCaffeMetadata
            ((pTVar5->name_).ptr_,&local_98,&local_b8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_78,local_c0);
  if (this->_oneof_case_[0] == 0x78) {
    this_00 = this->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0x78;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x58);
    CoreML::Specification::PoolingLayerParams::PoolingLayerParams(this_00.pooling_);
    (this->layer_).pooling_ = (PoolingLayerParams *)this_00;
  }
  pPVar15 = pTVar5->pooling_param_;
  if (pPVar15 == (PoolingParameter *)0x0) {
    pPVar15 = (PoolingParameter *)&caffe::_PoolingParameter_default_instance_;
  }
  uVar4 = pPVar15->pool_;
  if (uVar4 == 2) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"pool method","");
    layerName = (pTVar5->name_).ptr_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Pooling","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Stochastic","");
    unsupportedCaffeParrameterWithOption(&local_e0,layerName,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    uVar4 = pPVar15->pool_;
  }
  if (uVar4 < 2) {
    (this_00.pooling_)->type_ = uVar4;
  }
  if (pPVar15->global_pooling_ == true) {
    (this_00.pooling_)->globalpooling_ = true;
  }
  if (((pPVar15->_has_bits_).has_bits_[0] & 4) == 0) {
    uVar12 = pPVar15->pad_h_;
    uVar14 = pPVar15->pad_w_;
  }
  else {
    uVar12 = pPVar15->pad_;
    uVar14 = uVar12;
  }
  local_c0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(local_c0._4_4_,uVar14);
  if ((this_00.pooling_)->_oneof_case_[0] == 0x20) {
    pWVar6 = (this_00.scale_)->bias_;
  }
  else {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(this_00.pooling_);
    (this_00.pooling_)->_oneof_case_[0] = 0x20;
    pWVar6 = (WeightParams *)operator_new(0x28);
    CoreML::Specification::PoolingLayerParams_ValidCompletePadding::
    PoolingLayerParams_ValidCompletePadding((PoolingLayerParams_ValidCompletePadding *)pWVar6);
    (this_00.scale_)->bias_ = pWVar6;
  }
  iVar3 = (pWVar6->floatvalue_).current_size_;
  if (iVar3 == (pWVar6->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              ((RepeatedField<unsigned_long> *)&pWVar6->floatvalue_,iVar3 + 1);
    iVar3 = (pWVar6->floatvalue_).current_size_;
  }
  (pWVar6->floatvalue_).current_size_ = iVar3 + 1;
  *(ulong *)(((pWVar6->floatvalue_).rep_)->elements + (long)iVar3 * 2) = (ulong)uVar12;
  if ((this_00.pooling_)->_oneof_case_[0] == 0x20) {
    pWVar6 = (this_00.scale_)->bias_;
  }
  else {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(this_00.pooling_);
    (this_00.pooling_)->_oneof_case_[0] = 0x20;
    pWVar6 = (WeightParams *)operator_new(0x28);
    CoreML::Specification::PoolingLayerParams_ValidCompletePadding::
    PoolingLayerParams_ValidCompletePadding((PoolingLayerParams_ValidCompletePadding *)pWVar6);
    (this_00.scale_)->bias_ = pWVar6;
  }
  iVar3 = (pWVar6->floatvalue_).current_size_;
  if (iVar3 == (pWVar6->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              ((RepeatedField<unsigned_long> *)&pWVar6->floatvalue_,iVar3 + 1);
    iVar3 = (pWVar6->floatvalue_).current_size_;
  }
  (pWVar6->floatvalue_).current_size_ = iVar3 + 1;
  *(ulong *)(((pWVar6->floatvalue_).rep_)->elements + (long)iVar3 * 2) =
       (ulong)local_c0 & 0xffffffff;
  if (((pPVar15->_has_bits_).has_bits_[0] & 0x800) == 0) {
    uVar12 = pPVar15->stride_h_;
    uVar14 = pPVar15->stride_w_;
  }
  else {
    uVar12 = pPVar15->stride_;
    uVar14 = uVar12;
  }
  pRVar1 = &(this_00.convolution_)->stride_;
  iVar3 = ((this_00.convolution_)->stride_).current_size_;
  iVar8 = ((this_00.convolution_)->stride_).total_size_;
  if (iVar3 == iVar8) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,iVar3 + 1);
    iVar3 = ((this_00.convolution_)->stride_).current_size_;
    iVar8 = ((this_00.convolution_)->stride_).total_size_;
  }
  pBVar7 = (this_00.cropresize_)->boxindicesmode_;
  iVar9 = iVar3 + 1;
  ((this_00.convolution_)->stride_).current_size_ = iVar9;
  (&pBVar7->_internal_metadata_)[iVar3].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)(ulong)(uVar12 + (uVar12 == 0));
  if (iVar9 == iVar8) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,iVar3 + 2);
    iVar9 = ((this_00.convolution_)->stride_).current_size_;
    pBVar7 = (this_00.cropresize_)->boxindicesmode_;
  }
  pRVar1->current_size_ = iVar9 + 1;
  (&pBVar7->_internal_metadata_)[iVar9].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)(ulong)(uVar14 + (uVar14 == 0));
  if (((pPVar15->_has_bits_).has_bits_[0] & 2) == 0) {
    uVar12 = pPVar15->kernel_h_;
    uVar14 = pPVar15->kernel_w_;
  }
  else {
    uVar12 = pPVar15->kernel_size_;
    uVar14 = uVar12;
  }
  if ((uVar12 == 0 || uVar14 == 0) && (pPVar15->global_pooling_ == false)) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Kernel size must be non-zero","");
    errorInCaffeProto(&local_e0,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar1 = &(this_00.convolution_)->kernelsize_;
  iVar3 = ((this_00.convolution_)->kernelsize_).current_size_;
  iVar8 = ((this_00.convolution_)->kernelsize_).total_size_;
  if (iVar3 == iVar8) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,iVar3 + 1);
    iVar3 = ((this_00.convolution_)->kernelsize_).current_size_;
    iVar8 = ((this_00.convolution_)->kernelsize_).total_size_;
  }
  pWVar6 = (this_00.innerproduct_)->bias_;
  iVar9 = iVar3 + 1;
  ((this_00.convolution_)->kernelsize_).current_size_ = iVar9;
  (&pWVar6->_internal_metadata_)[iVar3].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)(ulong)uVar12;
  if (iVar9 == iVar8) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,iVar3 + 2);
    iVar9 = ((this_00.convolution_)->kernelsize_).current_size_;
    pWVar6 = (this_00.innerproduct_)->bias_;
  }
  pRVar1->current_size_ = iVar9 + 1;
  (&pWVar6->_internal_metadata_)[iVar9].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)(ulong)uVar14;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void CoreMLConverter::convertCaffePooling(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    Specification::PoolingLayerParams* specLayerParams = specLayer->mutable_pooling();
    const caffe::PoolingParameter& caffeLayerParams = caffeLayer.pooling_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.pool()==caffe::PoolingParameter::STOCHASTIC){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("pool method",caffeLayer.name(), "Pooling", "Stochastic");
    }
    //***************************************************************
    
    // Copy over the parameters.
    if (caffeLayerParams.pool() == caffe::PoolingParameter::MAX) {
        specLayerParams->set_type(Specification::PoolingLayerParams::MAX);
    } else if (caffeLayerParams.pool() == caffe::PoolingParameter::AVE) {
        specLayerParams->set_type(Specification::PoolingLayerParams::AVERAGE);
    }

    if (caffeLayerParams.global_pooling()) {
        specLayerParams->set_globalpooling(true);
    }

    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.has_pad()){
        pad_h = caffeLayerParams.pad();
        pad_w = caffeLayerParams.pad();
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_h));
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_w));
    
    uint32_t stride_h = 0;
    uint32_t stride_w = 0;
    if (caffeLayerParams.has_stride()){
        stride_h = caffeLayerParams.stride();
        stride_w = caffeLayerParams.stride();
    } else {
        stride_h = caffeLayerParams.stride_h();
        stride_w = caffeLayerParams.stride_w();
    }
    if (stride_w == 0) {
        stride_w = 1;
    }
    if (stride_h == 0){
        stride_h = 1;
    }
    specLayerParams->add_stride(static_cast<uint64_t>(stride_h));
    specLayerParams->add_stride(static_cast<uint64_t>(stride_w));
    
    uint32_t kernel_h = 0;
    uint32_t kernel_w = 0;
    if (caffeLayerParams.has_kernel_size()){
        kernel_h = caffeLayerParams.kernel_size();
        kernel_w = caffeLayerParams.kernel_size();
    } else {
        kernel_h = caffeLayerParams.kernel_h();
        kernel_w = caffeLayerParams.kernel_w();
    }
    if((kernel_h == 0 || (kernel_w == 0)) && !(caffeLayerParams.global_pooling())){
        CoreMLConverter::errorInCaffeProto("Kernel size must be non-zero",caffeLayer.name(),caffeLayer.type());
    }
    
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_h));
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_w));
}